

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

deMemPool * createPoolInternal(deMemPool *parent)

{
  MemPage *pMVar1;
  deMemPoolUtil *local_30;
  MemPage *initialPage;
  deMemPool *pool;
  deMemPool *parent_local;
  
  pMVar1 = MemPage_create(0x80);
  if (pMVar1 == (MemPage *)0x0) {
    parent_local = (deMemPool *)0x0;
  }
  else {
    parent_local = (deMemPool *)(pMVar1 + 1);
    pMVar1->bytesAllocated = pMVar1->bytesAllocated + 0x40;
    memset(parent_local,0,0x40);
    pMVar1[4].nextPage = pMVar1;
    pMVar1[1].nextPage = (MemPage *)parent;
    if (parent != (deMemPool *)0x0) {
      parent->numChildren = parent->numChildren + 1;
      if (parent->firstChild != (deMemPool *)0x0) {
        parent->firstChild->prevPool = parent_local;
      }
      *(deMemPool **)(pMVar1 + 4) = parent->firstChild;
      parent->firstChild = parent_local;
    }
    if (parent == (deMemPool *)0x0) {
      local_30 = (deMemPoolUtil *)0x0;
    }
    else {
      local_30 = parent->util;
    }
    *(deMemPoolUtil **)(pMVar1 + 2) = local_30;
  }
  return parent_local;
}

Assistant:

static deMemPool* createPoolInternal (deMemPool* parent)
{
	deMemPool*	pool;
	MemPage*	initialPage;

#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	if (parent && parent->allowFailing)
	{
		if ((deRandom_getUint32(&parent->failRandom) & 16383) <= 15)
			return DE_NULL;
	}
#endif

	/* Init first page. */
	initialPage = MemPage_create(INITIAL_PAGE_SIZE);
	if (!initialPage)
		return DE_NULL;

	/* Alloc pool from initial page. */
	DE_ASSERT((int)sizeof(deMemPool) <= initialPage->capacity);
	pool = (deMemPool*)(initialPage + 1);
	initialPage->bytesAllocated += (int)sizeof(deMemPool);

	memset(pool, 0, sizeof(deMemPool));
	pool->currentPage = initialPage;

	/* Register to parent. */
	pool->parent = parent;
	if (parent)
	{
		parent->numChildren++;
		if (parent->firstChild) parent->firstChild->prevPool = pool;
		pool->nextPool = parent->firstChild;
		parent->firstChild = pool;
	}

	/* Get utils from parent. */
	pool->util = parent ? parent->util : DE_NULL;

#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	pool->allowFailing = parent ? parent->allowFailing : DE_FALSE;
	deRandom_init(&pool->failRandom, parent ? deRandom_getUint32(&parent->failRandom) : 0x1234abcd);
#endif

#if defined(DE_SUPPORT_DEBUG_POOLS)
	pool->enableDebugAllocs		= parent ? parent->enableDebugAllocs : DE_FALSE;
	pool->debugAllocListHead	= DE_NULL;

	/* Pool allocation index. */
	{
		deMemPool* root = pool;
		while (root->parent)
			root = root->parent;

		if (pool == root)
			root->lastAllocatedIndex = 0;

		pool->allocIndex = ++root->lastAllocatedIndex;

		/* \note Put the index of leaking pool here and add a breakpoint to catch leaks easily. */
/*		if (pool->allocIndex == 51)
			root = root;*/
	}
#endif

	return pool;
}